

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O0

void __thiscall
assembler::asmcode::
add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[16]>
          (asmcode *this,operation *val,operand *val_1,operand *val_2,char (*val_3) [16])

{
  operation oVar1;
  operand oVar2;
  operand oVar3;
  reference this_00;
  reference this_01;
  allocator<char> local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  instruction ins;
  char (*val_local_3) [16];
  operand *val_local_2;
  operand *val_local_1;
  operation *val_local;
  asmcode *this_local;
  
  oVar1 = *val;
  oVar2 = *val_1;
  oVar3 = *val_2;
  ins.text.field_2._8_8_ = val_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,*val_3,&local_91);
  assembler::asmcode::instruction::instruction((instruction *)local_70,oVar1,oVar2,oVar3,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  this_00 = std::
            vector<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>,_std::allocator<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>_>
            ::back((vector<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>,_std::allocator<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>_>
                    *)(this + 0x18));
  this_01 = std::
            _List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>
            ::operator*(this_00);
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back(this_01,(value_type *)local_70);
  instruction::~instruction((instruction *)local_70);
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }